

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O1

void __thiscall
GdlFeatureSetting::SetLabelFromNameTable
          (GdlFeatureSetting *this,int nNameID,int nLangID,uint8 *pNameTbl)

{
  undefined4 in_register_00000034;
  uint8 *in_R8;
  wstring stuName;
  wstring local_60;
  wstring local_40;
  
  GdlFeatureDefn::GetLabelFromNameTable_abi_cxx11_
            (&local_40,(GdlFeatureDefn *)CONCAT44(in_register_00000034,nNameID),nLangID,
             (int)pNameTbl,in_R8);
  if (local_40._M_string_length != 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)&local_60,local_40._M_dataplus._M_p,
               local_40._M_dataplus._M_p + local_40._M_string_length);
    AddExtName(this,(utf16)nLangID,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 4 + 4);
    }
    this->m_wNameTblId = (unsigned_short)nNameID;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void GdlFeatureSetting::SetLabelFromNameTable(int nNameID, int nLangID, uint8 * pNameTbl)
{
	std::wstring stuName = GdlFeatureDefn::GetLabelFromNameTable(nNameID, nLangID, pNameTbl);
	if (stuName.length() != 0)
	{
		AddExtName(nLangID, stuName);
		m_wNameTblId = nNameID;
	}
}